

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::RegistryTest_reject_different_type_than_summary_Test::TestBody
          (RegistryTest_reject_different_type_than_summary_Test *this)

{
  bool bVar1;
  Builder<prometheus::Summary> *this_00;
  Builder<prometheus::Counter> *this_01;
  Builder<prometheus::Gauge> *this_02;
  Builder<prometheus::Histogram> *this_03;
  Builder<prometheus::Info> *this_04;
  AssertHelper local_180;
  undefined8 local_178;
  undefined1 local_170 [144];
  string same_name;
  Registry registry;
  
  std::__cxx11::string::string((string *)&same_name,"same_name",(allocator *)&registry);
  Registry::Registry(&registry,Merge);
  local_180.data_ = (AssertHelperData *)local_170;
  local_170._0_8_ = 0;
  local_170._8_8_ = 0;
  local_178 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    BuildSummary();
    this_00 = detail::Builder<prometheus::Summary>::Name
                        ((Builder<prometheus::Summary> *)(local_170 + 0x20),&same_name);
    detail::Builder<prometheus::Summary>::Register(this_00,&registry);
    detail::Builder<prometheus::Summary>::~Builder
              ((Builder<prometheus::Summary> *)(local_170 + 0x20));
  }
  std::__cxx11::string::~string((string *)&local_180);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildCounter();
      this_01 = detail::Builder<prometheus::Counter>::Name
                          ((Builder<prometheus::Counter> *)(local_170 + 0x20),&same_name);
      detail::Builder<prometheus::Counter>::Register(this_01,&registry);
      detail::Builder<prometheus::Counter>::~Builder
                ((Builder<prometheus::Counter> *)(local_170 + 0x20));
    }
  }
  testing::Message::Message((Message *)(local_170 + 0x20));
  testing::internal::AssertHelper::AssertHelper
            (&local_180,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
             ,0x6c,
             "Expected: BuildCounter().Name(same_name).Register(registry) throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_180,(Message *)(local_170 + 0x20));
  testing::internal::AssertHelper::~AssertHelper(&local_180);
  if ((long *)local_170._32_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_170._32_8_ + 8))();
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildGauge();
      this_02 = detail::Builder<prometheus::Gauge>::Name
                          ((Builder<prometheus::Gauge> *)(local_170 + 0x20),&same_name);
      detail::Builder<prometheus::Gauge>::Register(this_02,&registry);
      detail::Builder<prometheus::Gauge>::~Builder((Builder<prometheus::Gauge> *)(local_170 + 0x20))
      ;
    }
  }
  testing::Message::Message((Message *)(local_170 + 0x20));
  testing::internal::AssertHelper::AssertHelper
            (&local_180,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
             ,0x6d,
             "Expected: BuildGauge().Name(same_name).Register(registry) throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_180,(Message *)(local_170 + 0x20));
  testing::internal::AssertHelper::~AssertHelper(&local_180);
  if ((long *)local_170._32_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_170._32_8_ + 8))();
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildHistogram();
      this_03 = detail::Builder<prometheus::Histogram>::Name
                          ((Builder<prometheus::Histogram> *)(local_170 + 0x20),&same_name);
      detail::Builder<prometheus::Histogram>::Register(this_03,&registry);
      detail::Builder<prometheus::Histogram>::~Builder
                ((Builder<prometheus::Histogram> *)(local_170 + 0x20));
    }
  }
  testing::Message::Message((Message *)(local_170 + 0x20));
  testing::internal::AssertHelper::AssertHelper
            (&local_180,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
             ,0x6e,
             "Expected: BuildHistogram().Name(same_name).Register(registry) throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_180,(Message *)(local_170 + 0x20));
  testing::internal::AssertHelper::~AssertHelper(&local_180);
  if ((long *)local_170._32_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_170._32_8_ + 8))();
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildInfo();
      this_04 = detail::Builder<prometheus::Info>::Name
                          ((Builder<prometheus::Info> *)(local_170 + 0x20),&same_name);
      detail::Builder<prometheus::Info>::Register(this_04,&registry);
      detail::Builder<prometheus::Info>::~Builder((Builder<prometheus::Info> *)(local_170 + 0x20));
    }
  }
  testing::Message::Message((Message *)(local_170 + 0x20));
  testing::internal::AssertHelper::AssertHelper
            (&local_180,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
             ,0x6f,
             "Expected: BuildInfo().Name(same_name).Register(registry) throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_180,(Message *)(local_170 + 0x20));
  testing::internal::AssertHelper::~AssertHelper(&local_180);
  if ((long *)local_170._32_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_170._32_8_ + 8))();
  }
  Registry::~Registry(&registry);
  std::__cxx11::string::~string((string *)&same_name);
  return;
}

Assistant:

TEST(RegistryTest, reject_different_type_than_summary) {
  const auto same_name = std::string{"same_name"};
  Registry registry{};

  EXPECT_NO_THROW(BuildSummary().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildCounter().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildGauge().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildHistogram().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildInfo().Name(same_name).Register(registry));
}